

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::MergeFrom
          (UniDirectionalLSTMLayerParams *this,UniDirectionalLSTMLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  LSTMParams *pLVar2;
  LSTMWeightParams *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb406);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(from->activations_).super_RepeatedPtrFieldBase);
  if ((from != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_)
     && (from->params_ != (LSTMParams *)0x0)) {
    if (this->params_ == (LSTMParams *)0x0) {
      pLVar2 = (LSTMParams *)operator_new(0x20);
      LSTMParams::LSTMParams(pLVar2);
      this->params_ = pLVar2;
    }
    pLVar2 = from->params_;
    if (pLVar2 == (LSTMParams *)0x0) {
      pLVar2 = (LSTMParams *)&_LSTMParams_default_instance_;
    }
    LSTMParams::MergeFrom(this->params_,pLVar2);
  }
  if ((from != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_)
     && (from->weightparams_ != (LSTMWeightParams *)0x0)) {
    if (this->weightparams_ == (LSTMWeightParams *)0x0) {
      pLVar3 = (LSTMWeightParams *)operator_new(0x90);
      LSTMWeightParams::LSTMWeightParams(pLVar3);
      this->weightparams_ = pLVar3;
    }
    pLVar3 = from->weightparams_;
    if (pLVar3 == (LSTMWeightParams *)0x0) {
      pLVar3 = (LSTMWeightParams *)&_LSTMWeightParams_default_instance_;
    }
    LSTMWeightParams::MergeFrom(this->weightparams_,pLVar3);
  }
  if (from->inputvectorsize_ != 0) {
    this->inputvectorsize_ = from->inputvectorsize_;
  }
  if (from->outputvectorsize_ != 0) {
    this->outputvectorsize_ = from->outputvectorsize_;
  }
  if (from->reverseinput_ == true) {
    this->reverseinput_ = true;
  }
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::MergeFrom(const UniDirectionalLSTMLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  activations_.MergeFrom(from.activations_);
  if (from.has_params()) {
    mutable_params()->::CoreML::Specification::LSTMParams::MergeFrom(from.params());
  }
  if (from.has_weightparams()) {
    mutable_weightparams()->::CoreML::Specification::LSTMWeightParams::MergeFrom(from.weightparams());
  }
  if (from.inputvectorsize() != 0) {
    set_inputvectorsize(from.inputvectorsize());
  }
  if (from.outputvectorsize() != 0) {
    set_outputvectorsize(from.outputvectorsize());
  }
  if (from.reverseinput() != 0) {
    set_reverseinput(from.reverseinput());
  }
}